

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setnativeclosuredocstring(HSQUIRRELVM v,SQInteger idx,SQChar *docstring)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue *pSVar2;
  SQFunctionProto *pSVar3;
  SQLocalVarInfo *pSVar4;
  SQInteger SVar5;
  SQObjectPtr *pSVar6;
  SQString *pSVar7;
  SQRESULT SVar8;
  SQNativeClosure *nc;
  
  if (idx < 0) {
    pSVar6 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar6 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar6->super_SQObject)._type == OT_NATIVECLOSURE) {
    pSVar3 = (pSVar6->super_SQObject)._unVal.pFunctionProto;
    pSVar7 = SQString::Create(v->_sharedstate,docstring,-1);
    pSVar4 = pSVar3->_localvarinfos;
    SVar5 = pSVar3->_nlocalvarinfos;
    *(undefined4 *)&pSVar3->_nlocalvarinfos = 0x8000010;
    *(undefined1 *)((long)&pSVar3->_nlocalvarinfos + 4) = 0;
    pSVar3->_localvarinfos = (SQLocalVarInfo *)pSVar7;
    pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if (((uint)SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar4->_name).super_SQObject._unVal;
      pSVar2->pTable = (SQTable *)(pSVar2->nInteger + -1);
      if (pSVar2->pTable == (SQTable *)0x0) {
        (**(code **)(*(long *)&(pSVar4->_name).super_SQObject + 0x10))();
      }
    }
    SVar8 = 0;
  }
  else {
    sq_throwerror(v,"the object is not a nativeclosure");
    SVar8 = -1;
  }
  return SVar8;
}

Assistant:

SQRESULT sq_setnativeclosuredocstring(HSQUIRRELVM v,SQInteger idx,const SQChar *docstring)
{
    SQObject o = stack_get(v, idx);
    if(sq_isnativeclosure(o)) {
        SQNativeClosure *nc = _nativeclosure(o);
        nc->_docstring = SQString::Create(_ss(v), docstring);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a nativeclosure"));
}